

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O0

Type * __thiscall
soul::AST::ConcreteType::resolveAsType(Type *__return_storage_ptr__,ConcreteType *this)

{
  ConcreteType *this_local;
  
  Type::Type(__return_storage_ptr__,&this->type);
  return __return_storage_ptr__;
}

Assistant:

Type resolveAsType() const override             { return type; }